

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder1c.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  long lVar2;
  double *pdVar3;
  char *pcVar4;
  double *pdVar5;
  double dVar6;
  fcndata_t data;
  double local_3b8 [4];
  int ipvt [3];
  double y [15];
  double fvec [15];
  double wa [30];
  double fjac [45];
  
  data.y = y;
  pdVar3 = (double *)&DAT_00104020;
  pdVar5 = data.y;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar5 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar5 = pdVar5 + 1;
  }
  data.m = 0xf;
  local_3b8[0] = 1.0;
  local_3b8[1] = 1.0;
  local_3b8[2] = 1.0;
  dVar6 = dpmpar(1);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  uVar1 = lmder1(fcn,&data,0xf,3,local_3b8,fvec,fjac,0xf,dVar6,ipvt,wa,0x1e);
  enorm(0xf,fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n");
  lVar2 = 0;
  printf("      exit parameter                %10i\n\n",(ulong)uVar1);
  puts("      final approximate solution");
  do {
    pcVar4 = "";
    if (lVar2 == 0) {
      pcVar4 = "\n     ";
    }
    printf("%s%15.7g",local_3b8[lVar2],pcVar4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  putchar(10);
  return 0;
}

Assistant:

int main()
{
  int j, ldfjac, info, lwa;
  int ipvt[3];
  real tol, fnorm;
  real x[3], fvec[15], fjac[15*3], wa[30];
  const int m = 15;
  const int n = 3;
  /* auxiliary data (e.g. measurements) */
  real y[15] = {1.4e-1, 1.8e-1, 2.2e-1, 2.5e-1, 2.9e-1, 3.2e-1, 3.5e-1,
                  3.9e-1, 3.7e-1, 5.8e-1, 7.3e-1, 9.6e-1, 1.34, 2.1, 4.39};
  fcndata_t data;
  data.m = m;
  data.y = y;

/*      the following starting values provide a rough fit. */

  x[0] = 1.;
  x[1] = 1.;
  x[2] = 1.;

  ldfjac = 15;
  lwa = 30;

/*      set tol to the square root of the machine precision. */
/*      unless high solutions are required, */
/*      this is the recommended setting. */

  tol = sqrt(__cminpack_func__(dpmpar)(1));

  info = __cminpack_func__(lmder1)(fcn, &data, m, n, x, fvec, fjac, ldfjac, tol, 
	  ipvt, wa, lwa);
  fnorm = __cminpack_func__(enorm)(m, fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=0; j<n; ++j) {
    printf("%s%15.7g", j%3==0?"\n     ":"", (double)x[j]);
  }
  printf("\n");

  return 0;
}